

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

void __thiscall pbrt::BVHBuildNode::InitLeaf(BVHBuildNode *this,int first,int n,Bounds3f *b)

{
  float fVar1;
  long *in_FS_OFFSET;
  Bounds3f *b_local;
  int n_local;
  int first_local;
  BVHBuildNode *this_local;
  
  this->firstPrimOffset = first;
  this->nPrimitives = n;
  fVar1 = (b->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       (b->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar1;
  *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
       *(undefined8 *)&(b->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  fVar1 = (b->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (b->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar1;
  this->children[1] = (BVHBuildNode *)0x0;
  this->children[0] = (BVHBuildNode *)0x0;
  *(long *)(*in_FS_OFFSET + -0x220) = *(long *)(*in_FS_OFFSET + -0x220) + 1;
  *(long *)(*in_FS_OFFSET + -0x230) = *(long *)(*in_FS_OFFSET + -0x230) + 1;
  *(long *)(*in_FS_OFFSET + -0x238) = (long)n + *(long *)(*in_FS_OFFSET + -0x238);
  return;
}

Assistant:

void InitLeaf(int first, int n, const Bounds3f &b) {
        firstPrimOffset = first;
        nPrimitives = n;
        bounds = b;
        children[0] = children[1] = nullptr;
        ++leafNodes;
        ++totalLeafNodes;
        totalPrimitives += n;
    }